

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.cpp
# Opt level: O1

void __thiscall
embree::Instantiator::Instantiator
          (Instantiator *this,Ref<embree::HeightField> *heightField,
          Ref<embree::SceneGraph::Node> *object,Ref<embree::Image> *distribution,float minDistance,
          size_t N)

{
  HeightField *pHVar1;
  Node *pNVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  size_t width;
  size_t height;
  vector<float,_std::allocator<float>_> values;
  undefined1 local_71;
  size_t local_70;
  undefined8 local_68;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_60;
  size_t local_58;
  vector<float,_std::allocator<float>_> local_50;
  pointer local_38;
  
  (this->super_RefCount).refCounter.super___atomic_base<unsigned_long>._M_i = 0;
  (this->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__Instantiator_001d9ec8;
  pHVar1 = heightField->ptr;
  (this->heightField).ptr = pHVar1;
  if (pHVar1 != (HeightField *)0x0) {
    (*(pHVar1->super_RefCount)._vptr_RefCount[2])();
  }
  pNVar2 = object->ptr;
  (this->object).ptr = pNVar2;
  if (pNVar2 != (Node *)0x0) {
    (*(pNVar2->super_RefCount)._vptr_RefCount[2])();
  }
  (this->dist).super___shared_ptr<embree::Distribution2D,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->dist).super___shared_ptr<embree::Distribution2D,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->N = N;
  local_70 = distribution->ptr->width;
  local_58 = distribution->ptr->height;
  std::vector<float,_std::allocator<float>_>::vector
            (&local_50,local_58 * local_70,(allocator_type *)&local_68);
  if (local_58 != 0) {
    lVar5 = 0;
    uVar6 = 0;
    do {
      if (local_70 != 0) {
        uVar7 = 0;
        do {
          (*(distribution->ptr->super_RefCount)._vptr_RefCount[4])
                    (&local_68,distribution->ptr,uVar7,uVar6);
          *(float *)((long)local_50.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_start + uVar7 * 4 + local_70 * lVar5) =
               (float)local_68 * 0.212671 +
               local_68._4_4_ * 0.71516 + _Stack_60._M_pi._0_4_ * 0.072169;
          uVar7 = uVar7 + 1;
        } while (uVar7 < local_70);
      }
      uVar6 = uVar6 + 1;
      lVar5 = lVar5 + 4;
    } while (uVar6 < local_58);
  }
  local_38 = local_50.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_68 = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<embree::Distribution2D,std::allocator<embree::Distribution2D>,float*,unsigned_long&,unsigned_long&>
            (&_Stack_60,(Distribution2D **)&local_68,(allocator<embree::Distribution2D> *)&local_71,
             &local_38,&local_70,&local_58);
  _Var4._M_pi = _Stack_60._M_pi;
  peVar3 = local_68;
  local_68 = (Distribution2D *)0x0;
  _Stack_60._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_00 = (this->dist).super___shared_ptr<embree::Distribution2D,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  (this->dist).super___shared_ptr<embree::Distribution2D,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       peVar3;
  (this->dist).super___shared_ptr<embree::Distribution2D,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var4._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  if (_Stack_60._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_60._M_pi);
  }
  if (local_50.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_50.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

Instantiator(const Ref<HeightField>& heightField,
                 const Ref<SceneGraph::Node>& object, const Ref<Image>& distribution, float minDistance, size_t N)
      : heightField(heightField), object(object), /*minDistance(minDistance),*/ N(N)
    {
      /* create distribution */
      size_t width = distribution->width;
      size_t height = distribution->height;
      std::vector<float> values(width*height);
      for (size_t y=0; y<height; y++)
        for (size_t x=0; x<width; x++)
          values[y*width+x] = luminance(distribution->get(x,y));
      dist = std::make_shared<Distribution2D>(values.data(),width,height);
    }